

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::EnumStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQTable *this_00;
  SQObjectType SVar2;
  SQObjectValue this_01;
  SQObjectValue SVar3;
  SQObjectValue SVar4;
  SQObject SVar5;
  SQObject SVar6;
  SQObject SVar7;
  SQObjectPtr local_70;
  SQObjectPtr strongid;
  SQObjectPtr local_48;
  SQObjectValue local_38;
  
  Lex(this);
  SVar5 = Expect(this,0x102);
  local_38 = SVar5._unVal;
  SVar2 = SVar5._type;
  Expect(this,0x7b);
  SVar5 = SQFuncState::CreateTable(this->_fs);
  this_01 = SVar5._unVal;
  SVar3.pTable = (SQTable *)0x0;
  while (this->_token != 0x7d) {
    SVar6 = Expect(this,0x102);
    if (this->_token == 0x3d) {
      Lex(this);
      SVar7 = ExpectScalar(this);
      SVar4 = SVar3;
    }
    else {
      SVar4.pTable = (SQTable *)
                     ((long)&((SVar3.pTable)->super_SQDelegable).super_SQCollectable.
                             super_SQRefCounted._vptr_SQRefCounted + 1);
      SVar7._unVal.pTable = SVar3.pTable;
      SVar7._0_8_ = 0x5000002;
    }
    local_70.super_SQObject._unVal = SVar7._unVal;
    if ((SVar6._type >> 0x1b & 1) != 0) {
      pSVar1 = &((SVar6._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    local_70.super_SQObject._type = SVar7._type;
    if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    strongid.super_SQObject._type = SVar6._type;
    strongid.super_SQObject._unVal.nInteger = SVar6._unVal.nInteger;
    SQTable::NewSlot(this_01.pTable,&strongid,&local_70);
    SQObjectPtr::~SQObjectPtr(&local_70);
    SQObjectPtr::~SQObjectPtr(&strongid);
    SVar3 = SVar4;
    if (this->_token == 0x2c) {
      Lex(this);
    }
  }
  this_00 = (this->_vm->_sharedstate->_consts).super_SQObject._unVal.pTable;
  strongid.super_SQObject._unVal.pTable = local_38.pTable;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &((local_38.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    pSVar1 = &((local_38.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_70.super_SQObject._unVal.pTable = local_38.pTable;
  if ((SVar5._type >> 0x1b & 1) != 0) {
    pSVar1 = &((this_01.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_70.super_SQObject._type = SVar2;
  strongid.super_SQObject._type = SVar2;
  local_48.super_SQObject._type = SVar5._type;
  local_48.super_SQObject._unVal.nInteger = this_01.nInteger;
  SQTable::NewSlot(this_00,&local_70,&local_48);
  SQObjectPtr::~SQObjectPtr(&local_48);
  SQObjectPtr::~SQObjectPtr(&local_70);
  SQObjectPtr::Null(&strongid);
  Lex(this);
  SQObjectPtr::~SQObjectPtr(&strongid);
  return;
}

Assistant:

void EnumStatement()
    {
        Lex();
        SQObject id = Expect(TK_IDENTIFIER);
        Expect(_SC('{'));

        SQObject table = _fs->CreateTable();
        SQInteger nval = 0;
        while(_token != _SC('}')) {
            SQObject key = Expect(TK_IDENTIFIER);
            SQObject val;
            if(_token == _SC('=')) {
                Lex();
                val = ExpectScalar();
            }
            else {
                val._type = OT_INTEGER;
                val._unVal.nInteger = nval++;
            }
            _table(table)->NewSlot(SQObjectPtr(key),SQObjectPtr(val));
            if(_token == ',') Lex();
        }
        SQTable *enums = _table(_ss(_vm)->_consts);
        SQObjectPtr strongid = id;
        enums->NewSlot(SQObjectPtr(strongid),SQObjectPtr(table));
        strongid.Null();
        Lex();
    }